

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

BinsSelectExpr *
slang::ast::ConditionBinsSelectExpr::fromSyntax
          (BinsSelectConditionExprSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  int iVar2;
  DeclaredType *this;
  undefined4 extraout_var;
  Scope *pSVar3;
  Symbol *pSVar4;
  BinsSelectExpr *pBVar5;
  RangeListSyntax *pRVar6;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  sockaddr *in_RSI;
  long in_RDI;
  ExpressionSyntax *elem;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range3;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  Type *type;
  ConditionBinsSelectExpr *expr;
  Symbol *sym;
  Expression *nameExpr;
  Compilation *comp;
  Symbol *in_stack_fffffffffffffe68;
  Compilation *in_stack_fffffffffffffe70;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffe80;
  ASTContext *in_stack_fffffffffffffe88;
  SourceLocation in_stack_fffffffffffffe90;
  SourceLocation in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  DiagCode code;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 allowPacked;
  Expression *in_stack_fffffffffffffeb8;
  SyntaxNode *in_stack_fffffffffffffec0;
  Type *in_stack_fffffffffffffed8;
  sockaddr *syntax_00;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffef0;
  pointer local_100;
  size_t local_f8;
  bitmask<slang::ast::ASTFlags> local_f0;
  Expression *local_e8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_e0;
  iterator local_d8;
  iterator local_c8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_a8;
  SmallVectorBase<const_slang::ast::Expression_*> local_a0 [2];
  Type *local_60;
  ConditionBinsSelectExpr *local_58;
  SourceRange local_50;
  undefined4 local_3c;
  Symbol *local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  undefined8 local_28;
  Compilation *local_20;
  sockaddr *local_18;
  long local_10;
  
  code = SUB84((ulong)in_stack_fffffffffffffea0 >> 0x20,0);
  allowPacked = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x6d5e34);
  this = (DeclaredType *)
         not_null<slang::syntax::NameSyntax_*>::operator*
                   ((not_null<slang::syntax::NameSyntax_*> *)0x6d5e4d);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,AllowCoverpoint);
  iVar2 = Expression::bind((int)this,local_18,(socklen_t)local_30.m_bits);
  local_28 = CONCAT44(extraout_var,iVar2);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffe70);
  if (bVar1) {
    pBVar5 = BinsSelectExpr::badExpr
                       (in_stack_fffffffffffffe70,(BinsSelectExpr *)in_stack_fffffffffffffe68);
    return pBVar5;
  }
  local_38 = Expression::getSymbolReference(in_stack_fffffffffffffeb8,(bool)allowPacked);
  if (local_38 != (Symbol *)0x0) {
    syntax_00 = local_18;
    if (local_38->kind == Coverpoint) {
LAB_006d5faa:
      local_58 = BumpAllocator::
                 emplace<slang::ast::ConditionBinsSelectExpr,slang::ast::Symbol_const&>
                           (&in_stack_fffffffffffffe70->super_BumpAllocator,
                            in_stack_fffffffffffffe68);
      if (*(long *)(local_10 + 0x50) != 0) {
        if (local_38->kind == Coverpoint) {
          Symbol::as<slang::ast::CoverpointSymbol>((Symbol *)0x6d5ff4);
          local_60 = DeclaredType::getType(this);
        }
        else {
          pSVar3 = Symbol::getParentScope(local_38);
          Scope::asSymbol(pSVar3);
          Symbol::as<slang::ast::CoverpointSymbol>((Symbol *)0x6d6027);
          local_60 = DeclaredType::getType(this);
        }
        SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                  ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x6d6048);
        pRVar6 = not_null<slang::syntax::RangeListSyntax_*>::operator->
                           ((not_null<slang::syntax::RangeListSyntax_*> *)0x6d605d);
        local_a8 = &pRVar6->valueRanges;
        local_c8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                             ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x6d6082);
        local_d8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                             ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                              in_stack_fffffffffffffe70);
        while( true ) {
          bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                            ((self_type *)in_stack_fffffffffffffe70,
                             (iterator_base<slang::syntax::ExpressionSyntax_*> *)
                             in_stack_fffffffffffffe68);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          in_stack_fffffffffffffe80 =
               (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                            *)0x6d6112);
          local_f0.m_bits = 0;
          local_e0 = in_stack_fffffffffffffe80;
          bitmask<slang::ast::ASTFlags>::bitmask(&local_f0);
          local_e8 = bindCovergroupExpr((ExpressionSyntax *)syntax_00,(ASTContext *)this,
                                        in_stack_fffffffffffffed8,in_stack_fffffffffffffef0);
          SmallVectorBase<const_slang::ast::Expression_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffe70,
                     (Expression **)in_stack_fffffffffffffe68);
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                      *)in_stack_fffffffffffffe70);
        }
        iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (local_a0,(EVP_PKEY_CTX *)local_20,src);
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
        span<const_slang::ast::Expression_*,_18446744073709551615UL>
                  (in_stack_fffffffffffffe80,
                   (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
                   CONCAT44(extraout_var_00,iVar2));
        (local_58->intersects)._M_ptr = local_100;
        (local_58->intersects)._M_extent._M_extent_value = local_f8;
        SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                  ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x6d6266);
      }
      return &local_58->super_BinsSelectExpr;
    }
    if (local_38->kind == CoverageBin) {
      pSVar3 = Symbol::getParentScope(local_38);
      pSVar4 = Scope::asSymbol(pSVar3);
      syntax_00 = local_18;
      if (pSVar4->kind == Coverpoint) goto LAB_006d5faa;
    }
  }
  local_3c = 0x620007;
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x6d5f53);
  local_50 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffec0);
  sourceRange.endLoc = in_stack_fffffffffffffe98;
  sourceRange.startLoc = in_stack_fffffffffffffe90;
  ASTContext::addDiag(in_stack_fffffffffffffe88,code,sourceRange);
  pBVar5 = BinsSelectExpr::badExpr
                     (in_stack_fffffffffffffe70,(BinsSelectExpr *)in_stack_fffffffffffffe68);
  return pBVar5;
}

Assistant:

BinsSelectExpr& ConditionBinsSelectExpr::fromSyntax(const BinsSelectConditionExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& nameExpr = Expression::bind(*syntax.name, context, ASTFlags::AllowCoverpoint);
    if (nameExpr.bad())
        return badExpr(comp, nullptr);

    auto sym = nameExpr.getSymbolReference();
    if (!sym || (sym->kind != SymbolKind::Coverpoint &&
                 (sym->kind != SymbolKind::CoverageBin ||
                  sym->getParentScope()->asSymbol().kind != SymbolKind::Coverpoint))) {
        context.addDiag(diag::InvalidBinsTarget, syntax.name->sourceRange());
        return badExpr(comp, nullptr);
    }

    auto expr = comp.emplace<ConditionBinsSelectExpr>(*sym);

    if (syntax.intersects) {
        const Type* type;
        if (sym->kind == SymbolKind::Coverpoint)
            type = &sym->as<CoverpointSymbol>().declaredType.getType();
        else
            type = &sym->getParentScope()->asSymbol().as<CoverpointSymbol>().declaredType.getType();

        SmallVector<const Expression*> buffer;
        for (auto elem : syntax.intersects->ranges->valueRanges)
            buffer.push_back(&bindCovergroupExpr(*elem, context, type));
        expr->intersects = buffer.copy(comp);
    }

    return *expr;
}